

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O3

tuple<TPZCompMesh_*,_TPZVec<TPZCompMesh_*>_> * __thiscall
TPZHybridizeHDiv::Hybridize
          (tuple<TPZCompMesh_*,_TPZVec<TPZCompMesh_*>_> *__return_storage_ptr__,
          TPZHybridizeHDiv *this,TPZCompMesh *cmesh_HDiv,TPZVec<TPZCompMesh_*> *meshvec_HDiv,
          bool group_elements,double Lagrange_term_multiplier)

{
  int iVar1;
  TPZCompMesh *pTVar2;
  long lVar3;
  TPZManVector<TPZCompMesh_*,_3> meshvec_Hybrid;
  TPZManVector<TPZCompMesh_*,_3> local_b0;
  double local_78;
  TPZVec<TPZCompMesh_*> local_70;
  TPZCompMesh *local_50 [3];
  TPZCompMesh *local_38;
  
  local_70._vptr_TPZVec = (_func_int **)0x0;
  local_78 = Lagrange_term_multiplier;
  TPZManVector<TPZCompMesh_*,_3>::TPZManVector
            (&local_b0,meshvec_HDiv->fNElements,(TPZCompMesh **)&local_70);
  if (0 < meshvec_HDiv->fNElements) {
    lVar3 = 0;
    do {
      pTVar2 = TPZCompMesh::Clone(meshvec_HDiv->fStore[lVar3]);
      local_b0.super_TPZVec<TPZCompMesh_*>.fStore[lVar3] = pTVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 < meshvec_HDiv->fNElements);
  }
  ComputePeriferalMaterialIds(this,&local_b0.super_TPZVec<TPZCompMesh_*>);
  if ((1 < local_b0.super_TPZVec<TPZCompMesh_*>.fNElements) &&
     ((local_b0.super_TPZVec<TPZCompMesh_*>.fStore[1]->fMaterialVec)._M_t._M_impl.
      super__Rb_tree_header._M_node_count != 0)) {
    iVar1 = (**(code **)(*(long *)(local_b0.super_TPZVec<TPZCompMesh_*>.fStore[1]->fMaterialVec).
                                  _M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent
                        + 0x78))();
    this->fNState = iVar1;
  }
  InsertPeriferalMaterialObjects(this,&local_b0.super_TPZVec<TPZCompMesh_*>);
  HybridizeInternalSides(this,&local_b0.super_TPZVec<TPZCompMesh_*>);
  pTVar2 = CreateMultiphysicsMesh(this,cmesh_HDiv,&local_b0.super_TPZVec<TPZCompMesh_*>,local_78);
  CreateInterfaceElements(this,pTVar2,&local_b0.super_TPZVec<TPZCompMesh_*>);
  if (group_elements) {
    GroupandCondenseElements(pTVar2);
  }
  std::_Head_base<1ul,TPZManVector<TPZCompMesh*,3>,false>::_Head_base<TPZManVector<TPZCompMesh*,3>&>
            ((_Head_base<1ul,TPZManVector<TPZCompMesh*,3>,false> *)&local_70,&local_b0);
  local_38 = pTVar2;
  TPZVec<TPZCompMesh_*>::TPZVec((TPZVec<TPZCompMesh_*> *)__return_storage_ptr__,&local_70);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_TPZCompMesh_*,_TPZVec<TPZCompMesh_*>_>).
  super__Head_base<0UL,_TPZCompMesh_*,_false>._M_head_impl = local_38;
  if (local_70.fStore != local_50) {
    local_70.fNAlloc = 0;
    local_70._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018144b0;
    if (local_70.fStore != (TPZCompMesh **)0x0) {
      operator_delete__(local_70.fStore);
    }
  }
  if (local_b0.super_TPZVec<TPZCompMesh_*>.fStore != local_b0.fExtAlloc) {
    local_b0.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
    local_b0.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018144b0;
    if (local_b0.super_TPZVec<TPZCompMesh_*>.fStore != (TPZCompMesh **)0x0) {
      operator_delete__(local_b0.super_TPZVec<TPZCompMesh_*>.fStore);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<TPZCompMesh*, TPZVec<TPZCompMesh*> > TPZHybridizeHDiv::Hybridize(TPZCompMesh* cmesh_HDiv, TPZVec<TPZCompMesh*>& meshvec_HDiv, bool group_elements, double Lagrange_term_multiplier /* = 1. */) {
    TPZManVector<TPZCompMesh *, 3> meshvec_Hybrid(meshvec_HDiv.size(), 0);
    for (int i = 0; i < meshvec_HDiv.size(); i++) {
        meshvec_Hybrid[i] = meshvec_HDiv[i]->Clone();
    }
    ComputePeriferalMaterialIds(meshvec_Hybrid);
    ComputeNState(meshvec_Hybrid);
    /// insert the material objects for HDivWrap and LagrangeInterface
    InsertPeriferalMaterialObjects(meshvec_Hybrid);
    HybridizeInternalSides(meshvec_Hybrid);
    TPZCompMesh *cmesh_Hybrid = CreateMultiphysicsMesh(cmesh_HDiv, meshvec_Hybrid, Lagrange_term_multiplier);
    CreateInterfaceElements(cmesh_Hybrid, meshvec_Hybrid);
    if (group_elements){
        GroupandCondenseElements(cmesh_Hybrid);
    }
    return std::make_tuple(cmesh_Hybrid, meshvec_Hybrid);
}